

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O0

StrScanFmt lj_strscan_scan(uint8_t *p,MSize len,TValue *o,uint32_t opt)

{
  double dVar1;
  StrScanFmt SVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte bVar5;
  bool bVar6;
  double dVar7;
  uint32_t local_9c;
  double local_98;
  uint local_8c;
  int32_t i;
  double n;
  int negx;
  uint32_t xx;
  int32_t ex;
  uint32_t x;
  uint32_t hasdig;
  uint32_t dig;
  uint8_t *dp;
  uint8_t *sp;
  int base;
  int cmask;
  StrScanFmt fmt;
  TValue tmp;
  uint8_t *pe;
  int32_t neg;
  uint32_t opt_local;
  TValue *o_local;
  byte *pbStack_18;
  MSize len_local;
  uint8_t *p_local;
  
  pe._0_4_ = 0;
  pbStack_18 = p;
  if ((""[(ulong)*p + 1] & 8) == 0) {
    while ((""[(ulong)*pbStack_18 + 1] & 2) != 0) {
      pbStack_18 = pbStack_18 + 1;
    }
    if ((*pbStack_18 == 0x2b) || (*pbStack_18 == 0x2d)) {
      pe._0_4_ = (uint)(*pbStack_18 == 0x2d);
      pbStack_18 = pbStack_18 + 1;
    }
    if (0x40 < *pbStack_18) {
      _cmask = 0xfff8000000000000;
      if ((((*pbStack_18 | 0x20) == 0x69) && ((pbStack_18[1] | 0x20) == 0x6e)) &&
         ((pbStack_18[2] | 0x20) == 0x66)) {
        if ((uint)pe == 0) {
          _cmask = 0x7ff0000000000000;
        }
        else {
          _cmask = 0xfff0000000000000;
        }
        pbVar3 = pbStack_18 + 3;
        if ((((*pbVar3 | 0x20) == 0x69) && ((pbStack_18[4] | 0x20) == 0x6e)) &&
           (((pbStack_18[5] | 0x20) == 0x69 &&
            (((pbStack_18[6] | 0x20) == 0x74 && ((pbStack_18[7] | 0x20) == 0x79)))))) {
          pbVar3 = pbStack_18 + 8;
        }
      }
      else {
        pbVar3 = pbStack_18;
        if ((((*pbStack_18 | 0x20) == 0x6e) && ((pbStack_18[1] | 0x20) == 0x61)) &&
           ((pbStack_18[2] | 0x20) == 0x6e)) {
          pbVar3 = pbStack_18 + 3;
        }
      }
      while (pbStack_18 = pbVar3, (""[(ulong)*pbStack_18 + 1] & 2) != 0) {
        pbVar3 = pbStack_18 + 1;
      }
      if ((*pbStack_18 == 0) && (p + len <= pbStack_18)) {
        *o = _cmask;
        return STRSCAN_NUM;
      }
      return STRSCAN_ERROR;
    }
  }
  base = 3;
  bVar5 = 8;
  bVar6 = false;
  if ((opt & 0x10) != 0) {
    bVar6 = *pbStack_18 == 0x30;
  }
  sp._4_4_ = 10;
  if (bVar6) {
    sp._4_4_ = 0;
  }
  _hasdig = (byte *)0x0;
  x = 0;
  bVar6 = false;
  xx = 0;
  negx = 0;
  pbVar3 = pbStack_18;
  if (0x30 < *pbStack_18) {
LAB_001203b0:
    do {
      if ((""[(ulong)*pbStack_18 + 1] & bVar5) == 0) {
        if (*pbStack_18 != 0x2e) {
          if (!bVar6 && x == 0) {
            return STRSCAN_ERROR;
          }
          if (_hasdig != (byte *)0x0) {
            if (sp._4_4_ == 2) {
              return STRSCAN_ERROR;
            }
            base = 1;
            if (x != 0) {
              negx = (int)_hasdig - ((int)pbStack_18 + -1);
              _hasdig = pbStack_18 + -1;
              while( true ) {
                bVar6 = false;
                if (negx < 0) {
                  bVar6 = *_hasdig == 0x30;
                  _hasdig = _hasdig + -1;
                }
                if (!bVar6) break;
                negx = negx + 1;
                x = x - 1;
              }
              if (sp._4_4_ == 0x10) {
                negx = negx << 2;
              }
            }
          }
          if (9 < sp._4_4_) {
            bVar5 = 0x65;
            if (sp._4_4_ == 0x10) {
              bVar5 = 0x70;
            }
            if ((*pbStack_18 | 0x20) == bVar5) {
              bVar6 = false;
              base = 1;
              pbVar4 = pbStack_18 + 1;
              if ((*pbVar4 == 0x2b) || (*pbVar4 == 0x2d)) {
                bVar6 = *pbVar4 == 0x2d;
                pbVar4 = pbStack_18 + 2;
              }
              pbStack_18 = pbVar4;
              if ((""[(ulong)*pbStack_18 + 1] & 8) == 0) {
                return STRSCAN_ERROR;
              }
              n._4_4_ = *pbStack_18 & 0xf;
              while (pbStack_18 = pbStack_18 + 1, (""[(ulong)*pbStack_18 + 1] & 8) != 0) {
                if (n._4_4_ < 0x10000) {
                  n._4_4_ = n._4_4_ * 10 + (*pbStack_18 & 0xf);
                }
              }
              if (bVar6) {
                local_8c = -n._4_4_;
              }
              else {
                local_8c = n._4_4_;
              }
              negx = local_8c + negx;
            }
          }
          if (*pbStack_18 != 0) {
            if ((*pbStack_18 | 0x20) == 0x69) {
              if ((opt & 4) == 0) {
                return STRSCAN_ERROR;
              }
              pbStack_18 = pbStack_18 + 1;
              base = 2;
            }
            else if (base == 3) {
              if ((*pbStack_18 | 0x20) == 0x75) {
                pbStack_18 = pbStack_18 + 1;
                base = 4;
              }
              if ((*pbStack_18 | 0x20) == 0x6c) {
                if ((pbStack_18[1] | 0x20) == 0x6c) {
                  pbStack_18 = pbStack_18 + 2;
                }
                else {
                  pbStack_18 = pbStack_18 + 1;
                  if ((opt & 0x10) == 0) {
                    return STRSCAN_ERROR;
                  }
                }
                base = base + 2;
              }
              if (((*pbStack_18 | 0x20) == 0x75) && ((base == 3 || (base == 5)))) {
                pbStack_18 = pbStack_18 + 1;
                base = base + 1;
              }
              if (((base == 4) && ((opt & 0x10) == 0)) || ((4 < (uint)base && ((opt & 8) == 0)))) {
                return STRSCAN_ERROR;
              }
            }
            while ((""[(ulong)*pbStack_18 + 1] & 2) != 0) {
              pbStack_18 = pbStack_18 + 1;
            }
            if (*pbStack_18 != 0) {
              return STRSCAN_ERROR;
            }
          }
          if (pbStack_18 < p + len) {
            return STRSCAN_ERROR;
          }
          if (((base == 3) && (sp._4_4_ == 10)) &&
             ((x < 10 || (((x == 10 && (*pbVar3 < 0x33)) && (xx < (uint)pe + 0x80000000)))))) {
            if ((opt & 2) != 0) {
              if ((uint)pe == 0) {
                local_98 = (double)xx;
              }
              else {
                local_98 = -(double)xx;
              }
              o->n = local_98;
              return STRSCAN_NUM;
            }
            if ((uint)pe == 0) {
              local_9c = xx;
            }
            else {
              local_9c = -xx;
            }
            (o->field_4).i = local_9c;
            return STRSCAN_INT;
          }
          if (((sp._4_4_ == 0) && (base != 1)) && (base != 2)) {
            SVar2 = strscan_oct(pbVar3,o,base,(uint)pe,x);
            return SVar2;
          }
          if (sp._4_4_ == 0x10) {
            base = strscan_hex(pbVar3,o,base,opt,negx,(uint)pe,x);
          }
          else if (sp._4_4_ == 2) {
            base = strscan_bin(pbVar3,o,base,opt,negx,(uint)pe,x);
          }
          else {
            base = strscan_dec(pbVar3,o,base,opt,negx,(uint)pe,x);
          }
          if ((base == 1) && ((opt & 1) != 0)) {
            dVar1 = o->n;
            dVar7 = (double)(int)dVar1;
            if ((dVar1 == dVar7) && (!NAN(dVar1) && !NAN(dVar7))) {
              (o->field_4).i = (int)dVar1;
              return STRSCAN_INT;
            }
          }
          return base;
        }
        if (_hasdig != (byte *)0x0) {
          return STRSCAN_ERROR;
        }
        _hasdig = pbStack_18;
      }
      else {
        xx = xx * 10 + (*pbStack_18 & 0xf);
        x = x + 1;
      }
      pbStack_18 = pbStack_18 + 1;
    } while( true );
  }
  if (*pbStack_18 == 0x30) {
    if ((pbStack_18[1] | 0x20) == 0x78) {
      sp._4_4_ = 0x10;
      bVar5 = 0x10;
      pbStack_18 = pbStack_18 + 2;
    }
    else {
      if ((pbStack_18[1] | 0x20) == 0x62) {
        sp._4_4_ = 2;
        pbStack_18 = pbStack_18 + 2;
      }
      bVar5 = 8;
    }
  }
  do {
    if (*pbStack_18 == 0x30) {
      bVar6 = true;
    }
    else {
      pbVar3 = pbStack_18;
      if (*pbStack_18 != 0x2e) goto LAB_001203b0;
      if (_hasdig != (byte *)0x0) {
        return STRSCAN_ERROR;
      }
      _hasdig = pbStack_18;
    }
    pbStack_18 = pbStack_18 + 1;
  } while( true );
}

Assistant:

StrScanFmt lj_strscan_scan(const uint8_t *p, MSize len, TValue *o,
			   uint32_t opt)
{
  int32_t neg = 0;
  const uint8_t *pe = p + len;

  /* Remove leading space, parse sign and non-numbers. */
  if (LJ_UNLIKELY(!lj_char_isdigit(*p))) {
    while (lj_char_isspace(*p)) p++;
    if (*p == '+' || *p == '-') neg = (*p++ == '-');
    if (LJ_UNLIKELY(*p >= 'A')) {  /* Parse "inf", "infinity" or "nan". */
      TValue tmp;
      setnanV(&tmp);
      if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'f')) {
	if (neg) setminfV(&tmp); else setpinfV(&tmp);
	p += 3;
	if (casecmp(p[0],'i') && casecmp(p[1],'n') && casecmp(p[2],'i') &&
	    casecmp(p[3],'t') && casecmp(p[4],'y')) p += 5;
      } else if (casecmp(p[0],'n') && casecmp(p[1],'a') && casecmp(p[2],'n')) {
	p += 3;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p || p < pe) return STRSCAN_ERROR;
      o->u64 = tmp.u64;
      return STRSCAN_NUM;
    }
  }

  /* Parse regular number. */
  {
    StrScanFmt fmt = STRSCAN_INT;
    int cmask = LJ_CHAR_DIGIT;
    int base = (opt & STRSCAN_OPT_C) && *p == '0' ? 0 : 10;
    const uint8_t *sp, *dp = NULL;
    uint32_t dig = 0, hasdig = 0, x = 0;
    int32_t ex = 0;

    /* Determine base and skip leading zeros. */
    if (LJ_UNLIKELY(*p <= '0')) {
      if (*p == '0') {
	if (casecmp(p[1], 'x'))
	  base = 16, cmask = LJ_CHAR_XDIGIT, p += 2;
	else if (casecmp(p[1], 'b'))
	  base = 2, cmask = LJ_CHAR_DIGIT, p += 2;
      }
      for ( ; ; p++) {
	if (*p == '0') {
	  hasdig = 1;
	} else if (*p == '.') {
	  if (dp) return STRSCAN_ERROR;
	  dp = p;
	} else {
	  break;
	}
      }
    }

    /* Preliminary digit and decimal point scan. */
    for (sp = p; ; p++) {
      if (LJ_LIKELY(lj_char_isa(*p, cmask))) {
	x = x * 10 + (*p & 15);  /* For fast path below. */
	dig++;
      } else if (*p == '.') {
	if (dp) return STRSCAN_ERROR;
	dp = p;
      } else {
	break;
      }
    }
    if (!(hasdig | dig)) return STRSCAN_ERROR;

    /* Handle decimal point. */
    if (dp) {
      if (base == 2) return STRSCAN_ERROR;
      fmt = STRSCAN_NUM;
      if (dig) {
	ex = (int32_t)(dp-(p-1)); dp = p-1;
	while (ex < 0 && *dp-- == '0') ex++, dig--;  /* Skip trailing zeros. */
	if (base == 16) ex *= 4;
      }
    }

    /* Parse exponent. */
    if (base >= 10 && casecmp(*p, (uint32_t)(base == 16 ? 'p' : 'e'))) {
      uint32_t xx;
      int negx = 0;
      fmt = STRSCAN_NUM; p++;
      if (*p == '+' || *p == '-') negx = (*p++ == '-');
      if (!lj_char_isdigit(*p)) return STRSCAN_ERROR;
      xx = (*p++ & 15);
      while (lj_char_isdigit(*p)) {
	if (xx < 65536) xx = xx * 10 + (*p & 15);
	p++;
      }
      ex += negx ? -(int32_t)xx : (int32_t)xx;
    }

    /* Parse suffix. */
    if (*p) {
      /* I (IMAG), U (U32), LL (I64), ULL/LLU (U64), L (long), UL/LU (ulong). */
      /* NYI: f (float). Not needed until cp_number() handles non-integers. */
      if (casecmp(*p, 'i')) {
	if (!(opt & STRSCAN_OPT_IMAG)) return STRSCAN_ERROR;
	p++; fmt = STRSCAN_IMAG;
      } else if (fmt == STRSCAN_INT) {
	if (casecmp(*p, 'u')) p++, fmt = STRSCAN_U32;
	if (casecmp(*p, 'l')) {
	  p++;
	  if (casecmp(*p, 'l')) p++, fmt += STRSCAN_I64 - STRSCAN_INT;
	  else if (!(opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
	  else if (sizeof(long) == 8) fmt += STRSCAN_I64 - STRSCAN_INT;
	}
	if (casecmp(*p, 'u') && (fmt == STRSCAN_INT || fmt == STRSCAN_I64))
	  p++, fmt += STRSCAN_U32 - STRSCAN_INT;
	if ((fmt == STRSCAN_U32 && !(opt & STRSCAN_OPT_C)) ||
	    (fmt >= STRSCAN_I64 && !(opt & STRSCAN_OPT_LL)))
	  return STRSCAN_ERROR;
      }
      while (lj_char_isspace(*p)) p++;
      if (*p) return STRSCAN_ERROR;
    }
    if (p < pe) return STRSCAN_ERROR;

    /* Fast path for decimal 32 bit integers. */
    if (fmt == STRSCAN_INT && base == 10 &&
	(dig < 10 || (dig == 10 && *sp <= '2' && x < 0x80000000u+neg))) {
      if ((opt & STRSCAN_OPT_TONUM)) {
	o->n = neg ? -(double)x : (double)x;
	return STRSCAN_NUM;
      } else {
	o->i = neg ? -(int32_t)x : (int32_t)x;
	return STRSCAN_INT;
      }
    }

    /* Dispatch to base-specific parser. */
    if (base == 0 && !(fmt == STRSCAN_NUM || fmt == STRSCAN_IMAG))
      return strscan_oct(sp, o, fmt, neg, dig);
    if (base == 16)
      fmt = strscan_hex(sp, o, fmt, opt, ex, neg, dig);
    else if (base == 2)
      fmt = strscan_bin(sp, o, fmt, opt, ex, neg, dig);
    else
      fmt = strscan_dec(sp, o, fmt, opt, ex, neg, dig);

    /* Try to convert number to integer, if requested. */
    if (fmt == STRSCAN_NUM && (opt & STRSCAN_OPT_TOINT)) {
      double n = o->n;
      int32_t i = lj_num2int(n);
      if (n == (lua_Number)i) { o->i = i; return STRSCAN_INT; }
    }
    return fmt;
  }
}